

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::if_stmt(analysis *this)

{
  TYPE TVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  analysis *in_RSI;
  NodePtr NVar5;
  undefined1 local_e0 [39];
  allocator local_b9;
  string local_b8 [32];
  undefined1 local_98 [8];
  NodePtr tmp_ptr;
  string local_80 [36];
  int local_5c [6];
  allocator local_41;
  string local_40 [32];
  int local_20;
  byte local_19;
  analysis *this_local;
  NodePtr *ret;
  
  local_19 = 0;
  this_local = this;
  peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  local_20 = token::getLineno(peVar2);
  std::make_shared<dh::TreeNode,char_const(&)[3],int>((char (*) [3])this,(int *)"if");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"if",&local_41);
  match(in_RSI,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_5c[1] = 4;
  TreeNode::setNodeKind(peVar3,local_5c + 1);
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_5c[0] = 1;
  TreeNode::setKind(peVar3,local_5c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,"(",
             (allocator *)
             ((long)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  match(in_RSI,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  expr((analysis *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,")",&local_b9);
  match(in_RSI,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  TreeNode::appendChild(peVar3,(NodePtr *)local_98);
  stmt((analysis *)(local_e0 + 0x10));
  std::shared_ptr<dh::TreeNode>::operator=
            ((shared_ptr<dh::TreeNode> *)local_98,(shared_ptr<dh::TreeNode> *)(local_e0 + 0x10));
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)(local_e0 + 0x10));
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  TreeNode::appendChild(peVar3,(shared_ptr<dh::TreeNode> *)local_98);
  peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  TVar1 = token::getType(peVar2);
  if (TVar1 == ELSE) {
    stmt((analysis *)local_e0);
    std::shared_ptr<dh::TreeNode>::operator=
              ((shared_ptr<dh::TreeNode> *)local_98,(shared_ptr<dh::TreeNode> *)local_e0);
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_e0);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    TreeNode::appendChild(peVar3,(shared_ptr<dh::TreeNode> *)local_98);
  }
  local_19 = 1;
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_98);
  _Var4._M_pi = extraout_RDX;
  if ((local_19 & 1) == 0) {
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)this);
    _Var4._M_pi = extraout_RDX_00;
  }
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::if_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in if_stmt\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("if",tmp->getLineno());
	match("if");
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::IfK);

	match("(");
	NodePtr tmp_ptr = expr();
	match(")");
	ret->appendChild(tmp_ptr);

	tmp_ptr = stmt();
	ret->appendChild(tmp_ptr);

	if ( tmp->getType() == TYPE::ELSE)
	{
		tmp_ptr = stmt();
		ret->appendChild(tmp_ptr);
	}

	return ret;
}